

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

int __thiscall
GEO::geofile::adjust_volumes
          (geofile *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *changes)

{
  int iVar1;
  bool bVar2;
  key_type *pkVar3;
  pointer ppVar4;
  reference piVar5;
  pointer ppVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a8;
  iterator vector_it;
  iterator vector_it_end;
  iterator i_1;
  iterator phys_vol_map_it;
  iterator phys_vol_map_end;
  insert_return_type local_68;
  undefined1 local_40 [8];
  node_type nodeHandler;
  iterator i;
  iterator change_end;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *changes_local;
  geofile *this_local;
  
  i = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end(changes);
  nodeHandler._M_pmapped =
       (__pointer<typename_pair<const_int,_int>::second_type>)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                 (changes);
  while( true ) {
    bVar2 = std::operator!=((_Self *)&nodeHandler._M_pmapped,&i);
    if (!bVar2) break;
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&nodeHandler._M_pmapped);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::extract
              ((node_type *)local_40,&this->volumes_map,&ppVar6->first);
    bVar2 = std::
            _Node_handle_common<std::pair<const_int,_int>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_int>_>_>_>
            ::empty((_Node_handle_common<std::pair<const_int,_int>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_int>_>_>_>
                     *)local_40);
    if (!bVar2) {
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&nodeHandler._M_pmapped);
      iVar1 = ppVar6->second;
      pkVar3 = std::
               _Node_handle<int,_std::pair<const_int,_int>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_int>_>_>_>
               ::key((_Node_handle<int,_std::pair<const_int,_int>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_int>_>_>_>
                      *)local_40);
      *pkVar3 = iVar1;
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::insert
                (&local_68,&this->volumes_map,
                 (_Node_handle<int,_std::pair<const_int,_int>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_int>_>_>_>
                  *)local_40);
      std::
      _Node_insert_return<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_std::_Node_handle<int,_std::pair<const_int,_int>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_int>_>_>_>_>
      ::~_Node_insert_return(&local_68);
    }
    std::
    _Node_handle<int,_std::pair<const_int,_int>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_int>_>_>_>
    ::~_Node_handle((_Node_handle<int,_std::pair<const_int,_int>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_int>_>_>_>
                     *)local_40);
    std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&nodeHandler._M_pmapped,0);
  }
  phys_vol_map_it =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::end(&this->physical_volumes_map);
  i_1._M_node = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::begin(&this->physical_volumes_map);
  while( true ) {
    bVar2 = std::operator!=((_Self *)&i_1,&phys_vol_map_it);
    if (!bVar2) break;
    vector_it_end._M_current =
         (int *)std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                begin(changes);
    while( true ) {
      bVar2 = std::operator!=((_Self *)&vector_it_end,&i);
      if (!bVar2) break;
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                             *)&i_1);
      vector_it = std::vector<int,_std::allocator<int>_>::end(&ppVar4->second);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                             *)&i_1);
      local_a8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&ppVar4->second);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=(&local_a8,&vector_it);
        if (!bVar2) break;
        piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_a8);
        iVar1 = *piVar5;
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&vector_it_end);
        if (iVar1 == ppVar6->first) {
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&vector_it_end);
          iVar1 = ppVar6->second;
          piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_a8);
          *piVar5 = iVar1;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_a8,0);
      }
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&vector_it_end,0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                  *)&i_1,0);
  }
  return 0;
}

Assistant:

int GEO::geofile::adjust_volumes(std::map<int,int> changes)
{
    auto change_end = changes.end();
    for (auto i = changes.begin(); i != change_end; i++)
    {
        auto nodeHandler = volumes_map.extract(i->first);
        if(!nodeHandler.empty())
        {
            nodeHandler.key() = i->second;
            volumes_map.insert(std::move(nodeHandler));
        }
    }
    // Adjust dependencies to mirror the changes.
    // Physical volumes
    auto phys_vol_map_end  = physical_volumes_map.end();
    for (auto phys_vol_map_it = physical_volumes_map.begin(); phys_vol_map_it != phys_vol_map_end; phys_vol_map_it++)
    {
        for (auto i = changes.begin(); i != change_end; i++)
        {
            auto vector_it_end = phys_vol_map_it->second.end();
            for (auto vector_it = phys_vol_map_it->second.begin(); vector_it != vector_it_end; vector_it++)
            {
                if(*vector_it==i->first)
                    *vector_it=i->second;
            }
        }
    }
    return EXIT_SUCCESS;
}